

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_content_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_5b01dc::ScreenContentToolsMultiThreadTestLarge::
~ScreenContentToolsMultiThreadTestLarge(ScreenContentToolsMultiThreadTestLarge *this)

{
  code *pcVar1;
  ScreenContentToolsMultiThreadTestLarge *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

TEST_P(ScreenContentToolsMultiThreadTestLarge, ScreenContentToolsTest) {
  // Don't force screen content, however as the input is screen content
  // allow_screen_content_tools should still be turned on even with
  // multi-threaded encoding.
  ::libaom_test::Y4mVideoSource video_sc("desktop_credits.y4m", 0, 10);
  cfg_.g_profile = 1;
  cfg_.g_threads = 4;
  is_screen_content_violated_ = true;
  tune_content_ = AOM_CONTENT_DEFAULT;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video_sc));
  ASSERT_EQ(is_screen_content_violated_, false)
      << "Failed detection of screen content";
}